

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

void cuddLocalCacheClearDead(DdManager *manager)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_40;
  uint local_3c;
  uint j;
  uint i;
  DdNodePtr *key;
  DdLocalCacheItem *item;
  uint slots;
  uint itemsize;
  uint keysize;
  DdLocalCache *cache;
  DdManager *manager_local;
  
  _itemsize = manager->localCaches;
  do {
    if (_itemsize == (DdLocalCache *)0x0) {
      return;
    }
    uVar1 = _itemsize->keysize;
    uVar2 = _itemsize->itemsize;
    uVar3 = _itemsize->slots;
    key = &_itemsize->item->value;
    for (local_3c = 0; local_3c < uVar3; local_3c = local_3c + 1) {
      if (*key != (DdNodePtr)0x0) {
        if (*(int *)(((ulong)*key & 0xfffffffffffffffe) + 4) == 0) {
          *key = (DdNodePtr)0x0;
        }
        else {
          for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 1) {
            if (*(int *)(((ulong)key[(ulong)local_40 + 1] & 0xfffffffffffffffe) + 4) == 0) {
              *key = (DdNodePtr)0x0;
              break;
            }
          }
        }
      }
      key = (DdNodePtr *)((long)key + (ulong)uVar2);
    }
    _itemsize = _itemsize->next;
  } while( true );
}

Assistant:

void
cuddLocalCacheClearDead(
  DdManager * manager)
{
    DdLocalCache *cache = manager->localCaches;
    unsigned int keysize;
    unsigned int itemsize;
    unsigned int slots;
    DdLocalCacheItem *item;
    DdNodePtr *key;
    unsigned int i, j;

    while (cache != NULL) {
        keysize = cache->keysize;
        itemsize = cache->itemsize;
        slots = cache->slots;
        item = cache->item;
        for (i = 0; i < slots; i++) {
            if (item->value != NULL) {
                if (Cudd_Regular(item->value)->ref == 0) {
                    item->value = NULL;
                } else {
                    key = item->key;
                    for (j = 0; j < keysize; j++) {
                        if (Cudd_Regular(key[j])->ref == 0) {
                            item->value = NULL;
                            break;
                        }
                    }
                }
            }
            item = (DdLocalCacheItem *) ((char *) item + itemsize);
        }
        cache = cache->next;
    }
    return;

}